

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O2

QMenu * __thiscall QMainWindow::createPopupMenu(QMainWindow *this)

{
  long lVar1;
  QWidget *dockWidget;
  QObject *object;
  qsizetype qVar2;
  QWidget *this_00;
  QDockWidgetGroupWindow *this_01;
  QDockAreaLayoutInfo *this_02;
  QAction *pQVar3;
  int i;
  undefined1 *puVar4;
  int i_1;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_90;
  QArrayDataPointer<QToolBar_*> local_78;
  QArrayDataPointer<QDockWidget_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
  QObject::findChildren<QDockWidget*>
            ((QList<QDockWidget_*> *)&local_58,(QObject *)this,(FindChildOptions)0x1);
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
    this_00 = (QWidget *)0x0;
  }
  else {
    this_00 = (QWidget *)operator_new(0x28);
    QMenu::QMenu((QMenu *)this_00,&this->super_QWidget);
    for (puVar4 = (undefined1 *)0x0; puVar4 < (ulong)local_58.size; puVar4 = puVar4 + 1) {
      dockWidget = &local_58.ptr[(long)puVar4]->super_QWidget;
      object = *(QObject **)(*(long *)&dockWidget->field_0x8 + 0x10);
      if (object == (QObject *)this) {
        QDockAreaLayout::indexOf
                  ((QList<int> *)&local_78,(QDockAreaLayout *)(*(long *)(lVar1 + 0x260) + 0x1a0),
                   dockWidget);
LAB_003fc55f:
        qVar2 = local_78.size;
        QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_78);
        if (qVar2 != 0) {
          pQVar3 = QDockWidget::toggleViewAction(local_58.ptr[(long)puVar4]);
          QWidget::addAction(this_00,pQVar3);
        }
      }
      else {
        this_01 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>(object);
        if ((this_01 != (QDockWidgetGroupWindow *)0x0) &&
           (*(QMainWindow **)(*(long *)&(this_01->super_QWidget).field_0x8 + 0x10) == this)) {
          this_02 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)this_01);
          QDockAreaLayoutInfo::indexOf((QList<int> *)&local_78,this_02,dockWidget);
          goto LAB_003fc55f;
        }
      }
    }
    QMenu::addSeparator((QMenu *)this_00);
  }
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QToolBar **)&DAT_aaaaaaaaaaaaaaaa;
  QObject::findChildren<QToolBar*>
            ((QList<QToolBar_*> *)&local_78,(QObject *)this,(FindChildOptions)0x1);
  if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
    if (this_00 == (QWidget *)0x0) {
      this_00 = (QWidget *)operator_new(0x28);
      QMenu::QMenu((QMenu *)this_00,&this->super_QWidget);
    }
    for (puVar4 = (undefined1 *)0x0; puVar4 < (ulong)local_78.size; puVar4 = puVar4 + 1) {
      if (*(QMainWindow **)(*(long *)&(local_78.ptr[(long)puVar4]->super_QWidget).field_0x8 + 0x10)
          == this) {
        QToolBarAreaLayout::indexOf
                  ((QList<int> *)&local_90,(QToolBarAreaLayout *)(*(long *)(lVar1 + 0x260) + 0xa0),
                   &local_78.ptr[(long)puVar4]->super_QWidget);
        qVar2 = local_90.size;
        QArrayDataPointer<int>::~QArrayDataPointer(&local_90);
        if (qVar2 != 0) {
          pQVar3 = QToolBar::toggleViewAction(local_78.ptr[(long)puVar4]);
          QWidget::addAction(this_00,pQVar3);
        }
      }
    }
  }
  QArrayDataPointer<QToolBar_*>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QDockWidget_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QMenu *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QMenu *QMainWindow::createPopupMenu()
{
    Q_D(QMainWindow);
    QMenu *menu = nullptr;
#if QT_CONFIG(dockwidget)
    QList<QDockWidget *> dockwidgets = findChildren<QDockWidget *>();
    if (dockwidgets.size()) {
        menu = new QMenu(this);
        for (int i = 0; i < dockwidgets.size(); ++i) {
            QDockWidget *dockWidget = dockwidgets.at(i);
            // filter to find out if we own this QDockWidget
            if (dockWidget->parentWidget() == this) {
                if (d->layout->layoutState.dockAreaLayout.indexOf(dockWidget).isEmpty())
                    continue;
            } else if (QDockWidgetGroupWindow *dwgw =
                           qobject_cast<QDockWidgetGroupWindow *>(dockWidget->parentWidget())) {
                if (dwgw->parentWidget() != this)
                    continue;
                if (dwgw->layoutInfo()->indexOf(dockWidget).isEmpty())
                    continue;
            } else {
                continue;
            }
            menu->addAction(dockwidgets.at(i)->toggleViewAction());
        }
        menu->addSeparator();
    }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(toolbar)
    QList<QToolBar *> toolbars = findChildren<QToolBar *>();
    if (toolbars.size()) {
        if (!menu)
            menu = new QMenu(this);
        for (int i = 0; i < toolbars.size(); ++i) {
            QToolBar *toolBar = toolbars.at(i);
            if (toolBar->parentWidget() == this
                && (!d->layout->layoutState.toolBarAreaLayout.indexOf(toolBar).isEmpty())) {
                menu->addAction(toolbars.at(i)->toggleViewAction());
            }
        }
    }
#endif
    Q_UNUSED(d);
    return menu;
}